

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::GetValidityMask
               (ValidityMask *mask,ArrowArray *array,ArrowScanLocalState *scan_state,idx_t size,
               int64_t parent_offset,int64_t nested_offset,bool add_null)

{
  unsigned_long __n;
  byte bVar1;
  pointer puVar2;
  uint uVar3;
  int iVar4;
  ulong __n_00;
  ulong uVar5;
  byte bVar6;
  bool bVar7;
  vector<unsigned_char,_true> temp_nullmask;
  allocator_type local_51;
  ulong local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (((array->null_count != 0) && (0 < array->n_buffers)) && (*array->buffers != (void *)0x0)) {
    uVar5 = parent_offset + array->offset + scan_state->chunk_offset;
    if (nested_offset != -1) {
      uVar5 = array->offset + nested_offset;
    }
    TemplatedValidityMask<unsigned_long>::EnsureWritable
              (&mask->super_TemplatedValidityMask<unsigned_long>);
    __n_00 = size + 7 >> 3;
    if ((uVar5 & 7) == 0) {
      switchD_016b0717::default
                ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                 (void *)((uVar5 >> 3) + (long)*array->buffers),__n_00);
    }
    else {
      __n = __n_00 + 1;
      local_50 = __n_00;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,__n,&local_51);
      switchD_016b0717::default
                (local_48._M_impl.super__Vector_impl_data._M_start,
                 (void *)((uVar5 >> 3) + (long)*array->buffers),__n);
      puVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
      uVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert(__n);
      iVar4 = NumericCastImpl<int,_unsigned_long_long,_false>::Convert(uVar5 & 7);
      bVar6 = 0;
      while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, uVar5 = (ulong)uVar3, bVar7) {
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          bVar1 = puVar2[uVar5 - 1];
          puVar2[uVar5 - 1] = bVar1 >> 1 | bVar6;
          bVar6 = bVar1 << 7;
        }
      }
      switchD_016b0717::default
                ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                 local_48._M_impl.super__Vector_impl_data._M_start,local_50);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    }
  }
  if (add_null) {
    ValidityMask::Resize(mask,size + 1);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&mask->super_TemplatedValidityMask<unsigned_long>,size);
  }
  return;
}

Assistant:

static void GetValidityMask(ValidityMask &mask, ArrowArray &array, const ArrowScanLocalState &scan_state, idx_t size,
                            int64_t parent_offset, int64_t nested_offset = -1, bool add_null = false) {
	// In certains we don't need to or cannot copy arrow's validity mask to duckdb.
	//
	// The conditions where we do want to copy arrow's mask to duckdb are:
	// 1. nulls exist
	// 2. n_buffers > 0, meaning the array's arrow type is not `null`
	// 3. the validity buffer (the first buffer) is not a nullptr
	if (array.null_count != 0 && array.n_buffers > 0 && array.buffers[0]) {
		auto bit_offset = GetEffectiveOffset(array, parent_offset, scan_state, nested_offset);
		mask.EnsureWritable();
#if STANDARD_VECTOR_SIZE > 64
		auto n_bitmask_bytes = (size + 8 - 1) / 8;
		if (bit_offset % 8 == 0) {
			//! just memcpy nullmask
			memcpy((void *)mask.GetData(), ArrowBufferData<uint8_t>(array, 0) + bit_offset / 8, n_bitmask_bytes);
		} else {
			//! need to re-align nullmask
			vector<uint8_t> temp_nullmask(n_bitmask_bytes + 1);
			memcpy(temp_nullmask.data(), ArrowBufferData<uint8_t>(array, 0) + bit_offset / 8, n_bitmask_bytes + 1);
			ShiftRight(temp_nullmask.data(), NumericCast<int>(n_bitmask_bytes + 1),
			           NumericCast<int>(bit_offset % 8ull)); //! why this has to be a right shift is a mystery to me
			memcpy((void *)mask.GetData(), data_ptr_cast(temp_nullmask.data()), n_bitmask_bytes);
		}
#else
		auto byte_offset = bit_offset / 8;
		auto source_data = ArrowBufferData<uint8_t>(array, 0);
		bit_offset %= 8;
		for (idx_t i = 0; i < size; i++) {
			mask.Set(i, source_data[byte_offset] & (1 << bit_offset));
			bit_offset++;
			if (bit_offset == 8) {
				bit_offset = 0;
				byte_offset++;
			}
		}
#endif
	}
	if (add_null) {
		//! We are setting a validity mask of the data part of dictionary vector
		//! For some reason, Nulls are allowed to be indexes, hence we need to set the last element here to be null
		//! We might have to resize the mask
		mask.Resize(size + 1);
		mask.SetInvalid(size);
	}
}